

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

int luv_listen(lua_State *L)

{
  int status;
  uv_stream_t *stream;
  lua_Integer lVar1;
  int ret;
  int backlog;
  uv_stream_t *handle;
  lua_State *L_local;
  
  stream = luv_check_stream(L,1);
  lVar1 = luaL_checkinteger(L,2);
  luv_check_callback(L,(luv_handle_t *)stream->data,1,3);
  status = uv_listen(stream,(int)lVar1,luv_connection_cb);
  if (status < 0) {
    L_local._4_4_ = luv_error(L,status);
  }
  else {
    lua_pushinteger(L,(long)status);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int luv_listen(lua_State* L) {
  uv_stream_t* handle = luv_check_stream(L, 1);
  int backlog = luaL_checkinteger(L, 2);
  int ret;
  luv_check_callback(L, (luv_handle_t*)handle->data, LUV_CONNECTION, 3);
  ret = uv_listen(handle, backlog, luv_connection_cb);
  return luv_result(L, ret);
}